

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::GarbageCollector::abortCompaction(GarbageCollector *this)

{
  ulong *puVar1;
  VMHeap *pVVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar3;
  Oop *nativeObject;
  size_t sVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar5;
  AllocatedObject *pAVar6;
  AllocatedObject *liveHeader;
  AllocatedObject *this_00;
  
  pVVar2 = this->memoryManager->heap;
  this_00 = (AllocatedObject *)pVVar2->addressSpace;
  pAVar6 = (AllocatedObject *)((long)&this_00->rawForwardingPointer + pVVar2->size);
  for (; this_00 < pAVar6;
      this_00 = (AllocatedObject *)((long)&this_00->rawForwardingPointer + sVar4)) {
    sVar4 = AllocatedObject::computeSize(this_00);
    puVar1 = (ulong *)((long)&this_00->field_1 +
                      (ulong)((uint)this_00->rawForwardingPointer & 1) * 8);
    *puVar1 = *puVar1 & 0xfffffff8ffffffff;
  }
  if (this_00 == pAVar6) {
    paVar3 = &((this->nativeObjects).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>
               ._M_impl.super__Vector_impl_data._M_finish)->field_0;
    for (paVar5 = &((this->nativeObjects).
                    super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                    super__Vector_impl_data._M_start)->field_0; paVar5 != paVar3;
        paVar5 = paVar5 + 1) {
      *paVar5->header = (ObjectHeader)(*(ulong *)paVar5->header & 0xfffffff8ffffffff);
    }
    return;
  }
  __assert_fail("live == endAddress",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MemoryManager.cpp"
                ,0x26b,"void Lodtalk::GarbageCollector::abortCompaction()");
}

Assistant:

void GarbageCollector::abortCompaction()
{
    auto heap = memoryManager->getHeap();
    auto lowestAddress = heap->getAddressSpace();
    auto endAddress = lowestAddress + heap->getSize();

    auto live = lowestAddress;
    while(live < endAddress)
    {
        auto liveHeader = reinterpret_cast<AllocatedObject*> (live);
        auto liveSize = liveHeader->computeSize();

        // Set the color to white.
        liveHeader->header().gcColor = White;

        // Process the next object.
        live += liveSize;
    }
    assert(live == endAddress);

    // Set the white color of the native objects.
    for(auto &nativeObject : nativeObjects)
        nativeObject.header->gcColor = White;
}